

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::ReshapeParameter::InternalSerializeWithCachedSizesToArray
          (ReshapeParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobShape>
                       (1,this->shape_,deterministic,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,this->axis_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,this->num_axes_,target)
    ;
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = ReshapeParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* ReshapeParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ReshapeParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.BlobShape shape = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->shape_, deterministic, target);
  }

  // optional int32 axis = 2 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->axis(), target);
  }

  // optional int32 num_axes = 3 [default = -1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->num_axes(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ReshapeParameter)
  return target;
}